

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O2

void __thiscall cmMakefile::SetIncludeRegularExpression(cmMakefile *this,char *regex)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"INCLUDE_REGULAR_EXPRESSION",&local_39);
  SetProperty(this,&local_38,regex);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void SetIncludeRegularExpression(const char* regex)
  {
    this->SetProperty("INCLUDE_REGULAR_EXPRESSION", regex);
  }